

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void build_tls12_aad(uint8_t *aad,uint8_t type,uint64_t seq,uint16_t length)

{
  ulong local_30;
  size_t i;
  uint16_t length_local;
  uint64_t seq_local;
  uint8_t type_local;
  uint8_t *aad_local;
  
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    aad[local_30] = (uint8_t)(seq >> (0x38U - (char)(local_30 << 3) & 0x3f));
  }
  aad[8] = type;
  aad[9] = '\x03';
  aad[10] = '\x03';
  aad[0xb] = (uint8_t)(length >> 8);
  aad[0xc] = (uint8_t)length;
  return;
}

Assistant:

static void build_tls12_aad(uint8_t *aad, uint8_t type, uint64_t seq, uint16_t length)
{
    for (size_t i = 0; i < 8; ++i)
        aad[i] = (uint8_t)(seq >> (56 - i * 8));
    aad[8] = type;
    aad[9] = PTLS_RECORD_VERSION_MAJOR;
    aad[10] = PTLS_RECORD_VERSION_MINOR;
    aad[11] = length >> 8;
    aad[12] = (uint8_t)length;
}